

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

int testStateFeatureIsNotFP16_shouldFail(void)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  Rep *pRVar1;
  ulong uVar2;
  ModelDescription *interface;
  bool bVar3;
  ResultType RVar4;
  FeatureDescription *pFVar5;
  FeatureType *this_00;
  StateFeatureType *this_01;
  ArrayFeatureType *pAVar6;
  ostream *poVar7;
  int iVar8;
  Arena *pAVar9;
  ValidationPolicy validationPolicy;
  Model m;
  ValidationPolicy local_7c;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50,(Arena *)0x0,false);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pAVar9 = (Arena *)(local_50.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_50.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    local_50.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar9);
  }
  interface = local_50.description_;
  pRVar1 = ((local_50.description_)->state_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar1 == (Rep *)0x0) {
LAB_001442b1:
    this = &(local_50.description_)->state_;
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((this->super_RepeatedPtrFieldBase).arena_);
    pFVar5 = (FeatureDescription *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&this->super_RepeatedPtrFieldBase,pFVar5);
  }
  else {
    iVar8 = ((local_50.description_)->state_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar1->allocated_size <= iVar8) goto LAB_001442b1;
    ((local_50.description_)->state_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
    pFVar5 = (FeatureDescription *)pRVar1->elements[iVar8];
  }
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"x","");
  setupStateFeature(pFVar5,(string *)local_78);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  this_00 = pFVar5->type_;
  if (this_00 == (FeatureType *)0x0) {
    uVar2 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar9);
    pFVar5->type_ = this_00;
  }
  if (this_00->_oneof_case_[0] == 8) {
    this_01 = (this_00->Type_).statetype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this_00);
    this_00->_oneof_case_[0] = 8;
    uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StateFeatureType>
                        (pAVar9);
    (this_00->Type_).statetype_ = this_01;
  }
  if (this_01->_oneof_case_[0] == 1) {
    pAVar6 = (this_01->Type_).arraytype_;
  }
  else {
    CoreML::Specification::StateFeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 1;
    uVar2 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pAVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar9);
    (this_01->Type_).arraytype_ = pAVar6;
  }
  pAVar6->datatype_ = 0x10020;
  local_7c.allowsEmptyInput = true;
  local_7c.allowsEmptyOutput = true;
  local_7c.allowsMultipleFunctions = true;
  local_7c.allowsStatefulPrediction = true;
  CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1b5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy))).good())"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  else {
    CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
    RVar4 = CoreML::Result::type((Result *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._8_8_ != &local_60) {
      operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
    }
    iVar8 = 0;
    if (RVar4 == INVALID_MODEL_INTERFACE) goto LAB_0014458b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1b5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy)).type())"
               ,0x94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  std::ostream::put((char)poVar7);
  iVar8 = 1;
  std::ostream::flush();
LAB_0014458b:
  CoreML::Specification::Model::~Model(&local_50);
  return iVar8;
}

Assistant:

int testStateFeatureIsNotFP16_shouldFail() {
    Specification::Model m;
    auto *description = m.mutable_description();
    auto *state = description->add_state();

    setupStateFeature(state, "x");
    state->mutable_type()->mutable_statetype()->mutable_arraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);

    return 0;
}